

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outqueue.c
# Opt level: O0

uint64_t lzma_outq_memusage(uint64_t buf_size_max,uint32_t threads)

{
  lzma_ret lVar1;
  uint local_2c;
  uint64_t uStack_28;
  uint32_t bufs_count;
  uint64_t bufs_alloc_size;
  uint64_t uStack_18;
  uint32_t threads_local;
  uint64_t buf_size_max_local;
  
  bufs_alloc_size._4_4_ = threads;
  uStack_18 = buf_size_max;
  lVar1 = get_options(&stack0xffffffffffffffd8,&local_2c,buf_size_max,threads);
  if (lVar1 == LZMA_OK) {
    buf_size_max_local = (ulong)local_2c * 0x28 + 0x30 + uStack_28;
  }
  else {
    buf_size_max_local = 0xffffffffffffffff;
  }
  return buf_size_max_local;
}

Assistant:

extern uint64_t
lzma_outq_memusage(uint64_t buf_size_max, uint32_t threads)
{
	uint64_t bufs_alloc_size;
	uint32_t bufs_count;

	if (get_options(&bufs_alloc_size, &bufs_count, buf_size_max, threads)
			!= LZMA_OK)
		return UINT64_MAX;

	return sizeof(lzma_outq) + bufs_count * sizeof(lzma_outbuf)
			+ bufs_alloc_size;
}